

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_affinity(void)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_buf_t *buf;
  uv_loop_t *unaff_RBX;
  uv_process_options_t *loop;
  undefined1 *nread;
  uv_stream_t *stream;
  uv_loop_t *unaff_R14;
  uv_loop_t *unaff_R15;
  int64_t eval_b;
  char cpustr [11];
  int64_t eval_b_2;
  cpu_set_t cpuset;
  undefined1 auStack_8e8 [24];
  uv_buf_t uStack_8d0;
  uv_fs_t uStack_8b8;
  uv_pipe_t uStack_6f8;
  uv_stdio_container_t uStack_610;
  undefined4 uStack_600;
  undefined4 uStack_5f0;
  uv_loop_t *puStack_5d8;
  long lStack_5a0;
  uint uStack_598;
  int iStack_594;
  uv_buf_t uStack_590;
  char acStack_580 [16];
  uv_stdio_container_t uStack_570;
  uv_write_t uStack_558;
  uv_write_t uStack_490;
  uv_stream_t uStack_3c8;
  uv_fs_t uStack_2e0;
  uv_loop_t *puStack_120;
  uv_loop_t *puStack_118;
  uv_loop_t *puStack_110;
  long lStack_108;
  long lStack_100;
  uv_loop_t *puStack_f8;
  char cStack_e1;
  long lStack_e0;
  long lStack_d8;
  uv_loop_t *puStack_d0;
  uv_loop_t *local_c8;
  uv_loop_t *local_c0 [2];
  uv_loop_t *local_b0;
  cpu_set_t local_a8;
  
  puStack_d0 = (uv_loop_t *)0x1bee0f;
  uVar1 = uv_cpumask_size();
  if ((int)uVar1 < 1) {
    puStack_d0 = (uv_loop_t *)0x1beff8;
    run_test_spawn_affinity_cold_1();
LAB_001beff8:
    puStack_d0 = (uv_loop_t *)0x1bf005;
    run_test_spawn_affinity_cold_2();
LAB_001bf005:
    puStack_d0 = (uv_loop_t *)0x1bf012;
    run_test_spawn_affinity_cold_3();
    loop = (uv_process_options_t *)unaff_RBX;
LAB_001bf012:
    puVar4 = unaff_R14;
    puStack_d0 = (uv_loop_t *)0x1bf017;
    run_test_spawn_affinity_cold_9();
LAB_001bf017:
    puStack_d0 = (uv_loop_t *)0x1bf01c;
    run_test_spawn_affinity_cold_4();
LAB_001bf01c:
    puStack_d0 = (uv_loop_t *)0x1bf021;
    run_test_spawn_affinity_cold_5();
LAB_001bf021:
    puStack_d0 = (uv_loop_t *)0x1bf026;
    run_test_spawn_affinity_cold_6();
LAB_001bf026:
    puStack_d0 = (uv_loop_t *)0x1bf02b;
    run_test_spawn_affinity_cold_7();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar1;
    local_a8.__bits[0xe] = 0;
    local_a8.__bits[0xf] = 0;
    local_a8.__bits[0xc] = 0;
    local_a8.__bits[0xd] = 0;
    local_a8.__bits[10] = 0;
    local_a8.__bits[0xb] = 0;
    local_a8.__bits[8] = 0;
    local_a8.__bits[9] = 0;
    local_a8.__bits[6] = 0;
    local_a8.__bits[7] = 0;
    local_a8.__bits[4] = 0;
    local_a8.__bits[5] = 0;
    local_a8.__bits[2] = 0;
    local_a8.__bits[3] = 0;
    local_a8.__bits[0] = 0;
    local_a8.__bits[1] = 0;
    unaff_R14 = (uv_loop_t *)0x0;
    puStack_d0 = (uv_loop_t *)0x1bee4f;
    iVar2 = sched_getaffinity(0,0x80,&local_a8);
    if (iVar2 != 0) {
      puStack_d0 = (uv_loop_t *)0x1bee58;
      piVar3 = __errno_location();
      unaff_R14 = (uv_loop_t *)(long)*piVar3;
    }
    local_c8 = (uv_loop_t *)0x0;
    local_c0[0] = unaff_R14;
    if (unaff_R14 != (uv_loop_t *)0x0) goto LAB_001beff8;
    unaff_RBX = (uv_loop_t *)(ulong)uVar1;
    puVar4 = (uv_loop_t *)0x0;
    do {
      if ((puVar4 < (uv_loop_t *)0x400) &&
         (puVar5 = puVar4, (local_a8.__bits[(ulong)puVar4 >> 6] >> ((ulong)puVar4 & 0x3f) & 1) != 0)
         ) break;
      puVar4 = (uv_loop_t *)((long)&puVar4->data + 1);
      puVar5 = unaff_RBX;
    } while (unaff_RBX != puVar4);
    unaff_R15 = (uv_loop_t *)((ulong)puVar5 & 0xffffffff);
    local_c8 = unaff_RBX;
    local_c0[0] = unaff_R15;
    if (unaff_RBX <= unaff_R15) goto LAB_001bf005;
    puStack_d0 = (uv_loop_t *)0x1beed8;
    snprintf((char *)local_c0,0xb,"%d",unaff_R15);
    puStack_d0 = (uv_loop_t *)0x1beeeb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_d0 = (uv_loop_t *)0x1beef8;
    puVar4 = (uv_loop_t *)calloc((size_t)unaff_RBX,1);
    loop = (uv_process_options_t *)unaff_RBX;
    if (puVar4 == (uv_loop_t *)0x0) goto LAB_001bf012;
    *(undefined1 *)((long)unaff_R15->reserved + (long)(puVar4->reserved + -0xe)) = 1;
    loop = &options;
    options.cpumask = (char *)puVar4;
    options.cpumask_size = (size_t)unaff_RBX;
    options.args[2] = (char *)local_c0;
    options.args[3] = "dummy";
    puStack_d0 = (uv_loop_t *)0x1bef40;
    puVar5 = uv_default_loop();
    puStack_d0 = (uv_loop_t *)0x1bef52;
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 != 0) goto LAB_001bf017;
    puStack_d0 = (uv_loop_t *)0x1bef5f;
    puVar5 = uv_default_loop();
    puStack_d0 = (uv_loop_t *)0x1bef69;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001bf01c;
    if (exit_cb_called != 1) goto LAB_001bf021;
    if (close_cb_called != 1) goto LAB_001bf026;
    puStack_d0 = (uv_loop_t *)0x1bef93;
    free(puVar4);
    puStack_d0 = (uv_loop_t *)0x1bef98;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_d0 = (uv_loop_t *)0x1befac;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_d0 = (uv_loop_t *)0x1befb6;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    local_c8 = (uv_loop_t *)0x0;
    puStack_d0 = (uv_loop_t *)0x1befc3;
    puVar5 = uv_default_loop();
    puStack_d0 = (uv_loop_t *)0x1befcb;
    iVar2 = uv_loop_close(puVar5);
    local_b0 = (uv_loop_t *)(long)iVar2;
    if (local_c8 == local_b0) {
      puStack_d0 = (uv_loop_t *)0x1befe2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_d0 = (uv_loop_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_f8 = (uv_loop_t *)0x1bf042;
  puStack_d0 = (uv_loop_t *)loop;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    puStack_f8 = (uv_loop_t *)0x1bf101;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf101:
    puStack_f8 = (uv_loop_t *)0x1bf106;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf106:
    puStack_f8 = (uv_loop_t *)0x1bf10b;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_f8 = (uv_loop_t *)0x1bf05d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_e1;
    cStack_e1 = '\0';
    options.cpumask_size = 0;
    loop = &options;
    puStack_f8 = (uv_loop_t *)0x1bf083;
    puVar5 = uv_default_loop();
    puStack_f8 = (uv_loop_t *)0x1bf095;
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 != -0x16) goto LAB_001bf101;
    if (exit_cb_called != 0) goto LAB_001bf106;
    puStack_f8 = (uv_loop_t *)0x1bf0a8;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_f8 = (uv_loop_t *)0x1bf0bc;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_f8 = (uv_loop_t *)0x1bf0c6;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    lStack_d8 = 0;
    puStack_f8 = (uv_loop_t *)0x1bf0d4;
    puVar5 = uv_default_loop();
    puStack_f8 = (uv_loop_t *)0x1bf0dc;
    iVar2 = uv_loop_close(puVar5);
    lStack_e0 = (long)iVar2;
    if (lStack_d8 == lStack_e0) {
      puStack_f8 = (uv_loop_t *)0x1bf0f4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_f8 = (uv_loop_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_110 = (uv_loop_t *)0x1bf12d;
  puStack_f8 = (uv_loop_t *)loop;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_110 = (uv_loop_t *)0x1bf132;
  puVar5 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1bf148;
  iVar2 = uv_spawn(puVar5,&process,&options);
  lStack_100 = (long)iVar2;
  lStack_108 = 0;
  if (lStack_100 == 0) {
    puStack_110 = (uv_loop_t *)0x1bf16b;
    puVar5 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1bf175;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStack_100 = (long)iVar2;
    lStack_108 = 0;
    if (lStack_100 != 0) goto LAB_001bf286;
    puStack_110 = (uv_loop_t *)0x1bf19f;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    lStack_100 = (long)iVar2;
    lStack_108 = 0;
    if (lStack_100 != 0) goto LAB_001bf293;
    puStack_110 = (uv_loop_t *)0x1bf1cb;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puStack_110 = (uv_loop_t *)0x1bf1d0;
    puVar5 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1bf1da;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStack_100 = (long)iVar2;
    lStack_108 = 0;
    if (lStack_100 != 0) goto LAB_001bf2a0;
    lStack_100 = 1;
    puStack_110 = (uv_loop_t *)0x1bf20d;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    lStack_108 = (long)iVar2;
    if (lStack_100 != lStack_108) goto LAB_001bf2ad;
    puStack_110 = (uv_loop_t *)0x1bf227;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1bf23b;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_110 = (uv_loop_t *)0x1bf245;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    lStack_100 = 0;
    puStack_110 = (uv_loop_t *)0x1bf253;
    puVar5 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1bf25b;
    iVar2 = uv_loop_close(puVar5);
    lStack_108 = (long)iVar2;
    if (lStack_100 == lStack_108) {
      puStack_110 = (uv_loop_t *)0x1bf271;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_110 = (uv_loop_t *)0x1bf286;
    run_test_spawn_auto_unref_cold_1();
LAB_001bf286:
    puStack_110 = (uv_loop_t *)0x1bf293;
    run_test_spawn_auto_unref_cold_2();
LAB_001bf293:
    puStack_110 = (uv_loop_t *)0x1bf2a0;
    run_test_spawn_auto_unref_cold_3();
LAB_001bf2a0:
    puStack_110 = (uv_loop_t *)0x1bf2ad;
    run_test_spawn_auto_unref_cold_4();
LAB_001bf2ad:
    puStack_110 = (uv_loop_t *)0x1bf2ba;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_110 = (uv_loop_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_580,"/dev/null",10);
  puStack_120 = (uv_loop_t *)loop;
  puStack_118 = puVar4;
  puStack_110 = unaff_R15;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_2e0,acStack_580,2,0,(uv_fs_cb)0x0);
  uStack_3c8.data = (void *)(long)iVar2;
  uStack_490.data = (void *)0x0;
  if (uStack_3c8.data == (void *)0x0) {
    loop = (uv_process_options_t *)(ulong)(uint)uStack_2e0.result;
    uStack_598 = (uint)uStack_2e0.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar4 = uv_default_loop();
    iVar2 = uv_pipe_init(puVar4,(uv_pipe_t *)&uStack_3c8,0);
    uStack_490.data = (void *)(long)iVar2;
    uStack_558.data = (void *)0x0;
    if (uStack_490.data != (void *)0x0) goto LAB_001bf5e0;
    options.stdio = &uStack_570;
    uStack_570.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_570.data.stream = &uStack_3c8;
    iStack_594 = dup((uint)uStack_2e0.result);
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    uStack_490.data = (void *)(long)iVar2;
    uStack_558.data = (void *)0x0;
    if (uStack_490.data != (void *)0x0) goto LAB_001bf5f2;
    uStack_590 = uv_buf_init((char *)&uStack_598,4);
    iVar2 = uv_write(&uStack_490,&uStack_3c8,&uStack_590,1,write_null_cb);
    uStack_558.data = (void *)(long)iVar2;
    if (uStack_558.data != (void *)0x0) goto LAB_001bf604;
    uStack_590 = uv_buf_init((char *)&iStack_594,4);
    iVar2 = uv_write(&uStack_558,&uStack_3c8,&uStack_590,1,write_cb);
    lStack_5a0 = 0;
    if (iVar2 != 0) goto LAB_001bf613;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    lStack_5a0 = 0;
    if (iVar2 != 0) goto LAB_001bf622;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_2e0,uStack_598,(uv_fs_cb)0x0);
    lStack_5a0 = 0;
    if (iVar2 != 0) goto LAB_001bf631;
    lStack_5a0 = (long)exit_cb_called;
    if (lStack_5a0 != 1) goto LAB_001bf640;
    lStack_5a0 = (long)close_cb_called;
    if (lStack_5a0 != 2) goto LAB_001bf64f;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    lStack_5a0 = (long)iVar2;
    if (lStack_5a0 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5e0:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5f2:
    run_test_spawn_fs_open_cold_3();
LAB_001bf604:
    run_test_spawn_fs_open_cold_4();
LAB_001bf613:
    run_test_spawn_fs_open_cold_5();
LAB_001bf622:
    run_test_spawn_fs_open_cold_6();
LAB_001bf631:
    run_test_spawn_fs_open_cold_7();
LAB_001bf640:
    run_test_spawn_fs_open_cold_8();
LAB_001bf64f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_5a0;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_5d8 = (uv_loop_t *)loop;
  uStack_8d0 = uv_buf_init("",1);
  iVar2 = uv_pipe((uv_os_fd_t *)(auStack_8e8 + 0x10),0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_610;
    uStack_610.flags = UV_INHERIT_FD;
    uStack_610.data.file = auStack_8e8._16_4_;
    uStack_600 = 0;
    uStack_5f0 = 0;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    uStack_8b8.data = (void *)(long)iVar2;
    uStack_6f8.data = (void *)0x0;
    if ((uv_handle_t *)uStack_8b8.data != (uv_handle_t *)0x0) goto LAB_001bfb1b;
    uv_unref((uv_handle_t *)&process);
    puVar4 = uv_default_loop();
    iVar2 = uv_pipe_init(puVar4,&uStack_6f8,0);
    uStack_8b8.data = (void *)(long)iVar2;
    auStack_8e8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8b8.data != (uv_handle_t *)0x0) goto LAB_001bfb2d;
    iVar2 = uv_pipe_open(&uStack_6f8,auStack_8e8._16_4_);
    uStack_8b8.data = (void *)(long)iVar2;
    auStack_8e8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8b8.data != (uv_handle_t *)0x0) goto LAB_001bfb3c;
    auStack_8e8._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start((uv_stream_t *)&uStack_6f8,on_alloc,on_read_once);
    uStack_8b8.data = (void *)(long)iVar2;
    auStack_8e8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8b8.data != (uv_handle_t *)0x0) goto LAB_001bfb4b;
    auStack_8e8._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_8b8,auStack_8e8._20_4_,&uStack_8d0,1,-1,
                        (uv_fs_cb)0x0);
    auStack_8e8._8_8_ = SEXT48(iVar2);
    if (auStack_8e8._0_8_ != auStack_8e8._8_8_) goto LAB_001bfb5a;
    auStack_8e8._0_8_ = (uv_loop_t *)0x1;
    auStack_8e8._8_8_ = uStack_8b8.result;
    if ((uv_loop_t *)uStack_8b8.result != (uv_loop_t *)0x1) goto LAB_001bfb69;
    uv_fs_req_cleanup(&uStack_8b8);
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_ONCE);
    auStack_8e8._0_8_ = SEXT48(iVar2);
    auStack_8e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb78;
    auStack_8e8._0_8_ = (uv_loop_t *)0x1;
    auStack_8e8._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_8e8._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb87;
    uv_close((uv_handle_t *)&uStack_6f8,close_cb);
    auStack_8e8._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_8b8,auStack_8e8._20_4_,&uStack_8d0,1,-1,
                        (uv_fs_cb)0x0);
    auStack_8e8._8_8_ = SEXT48(iVar2);
    if (auStack_8e8._0_8_ != auStack_8e8._8_8_) goto LAB_001bfb96;
    auStack_8e8._0_8_ = (uv_loop_t *)0x1;
    auStack_8e8._8_8_ = uStack_8b8.result;
    if ((uv_loop_t *)uStack_8b8.result != (uv_loop_t *)0x1) goto LAB_001bfba5;
    uv_fs_req_cleanup(&uStack_8b8);
    puVar4 = uv_default_loop();
    iVar2 = uv_timer_init(puVar4,&timer);
    auStack_8e8._0_8_ = SEXT48(iVar2);
    auStack_8e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbb4;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_8e8._0_8_ = SEXT48(iVar2);
    auStack_8e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbc3;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_ONCE);
    if (iVar2 == 1) {
      puVar4 = uv_default_loop();
      iVar2 = uv_run(puVar4,UV_RUN_ONCE);
      auStack_8e8._0_8_ = SEXT48(iVar2);
      auStack_8e8._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_8e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfc0e;
    }
    auStack_8e8._0_8_ = (uv_loop_t *)0x1;
    auStack_8e8._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_8e8._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbd2;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_8e8._0_8_ = SEXT48(iVar2);
    auStack_8e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe1;
    iVar2 = close(auStack_8e8._20_4_);
    auStack_8e8._0_8_ = SEXT48(iVar2);
    auStack_8e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbf0;
    auStack_8e8._20_4_ = -1;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_8e8._0_8_ = (uv_loop_t *)0x0;
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    auStack_8e8._8_8_ = SEXT48(iVar2);
    if (auStack_8e8._0_8_ == auStack_8e8._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfb1b:
    run_test_closed_fd_events_cold_2();
LAB_001bfb2d:
    run_test_closed_fd_events_cold_3();
LAB_001bfb3c:
    run_test_closed_fd_events_cold_4();
LAB_001bfb4b:
    run_test_closed_fd_events_cold_5();
LAB_001bfb5a:
    run_test_closed_fd_events_cold_6();
LAB_001bfb69:
    run_test_closed_fd_events_cold_7();
LAB_001bfb78:
    run_test_closed_fd_events_cold_8();
LAB_001bfb87:
    run_test_closed_fd_events_cold_9();
LAB_001bfb96:
    run_test_closed_fd_events_cold_10();
LAB_001bfba5:
    run_test_closed_fd_events_cold_11();
LAB_001bfbb4:
    run_test_closed_fd_events_cold_12();
LAB_001bfbc3:
    run_test_closed_fd_events_cold_13();
LAB_001bfbd2:
    run_test_closed_fd_events_cold_15();
LAB_001bfbe1:
    run_test_closed_fd_events_cold_16();
LAB_001bfbf0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfc0e:
  stream = (uv_stream_t *)auStack_8e8;
  nread = auStack_8e8 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_affinity) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int i;
  int r;
  int cpu;
  char cpustr[11];
  char* newmask;
  int cpumask_size;
#if defined(_WIN32)
  DWORD_PTR procmask;
  DWORD_PTR sysmask;
#elif defined(__linux__)
  cpu_set_t cpuset;
#else
  cpuset_t cpuset;
#endif

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  /* find a cpu we can use */
  cpu = cpumask_size;
#ifdef _WIN32
  r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
  ASSERT_NE(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (procmask & (((DWORD_PTR)1) << i)) {
      cpu = i;
      break;
    }
  }
#else
  CPU_ZERO(&cpuset);
#ifdef __linux__
  r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
  if (r)
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
  ASSERT_EQ(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (CPU_ISSET(i, &cpuset)) {
      cpu = i;
      break;
    }
  }
#endif
  ASSERT_LT(cpu, cpumask_size);
  snprintf(cpustr, sizeof(cpustr), "%d", cpu);

  init_process_options("spawn_helper_affinity", exit_cb);

  /* mask the child to just one cpu */
  newmask = (char*)calloc(cpumask_size, 1);
  ASSERT(newmask != NULL);
  newmask[cpu] = 1;
  options.cpumask_size = (size_t)cpumask_size;
  options.cpumask = newmask;

  /* tell the child which one it should get */
  options.args[2] = cpustr;
  options.args[3] = "dummy"; /* need 4 args for test/run-tests.c dispatch */

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  free(newmask);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}